

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pe_crypto.cpp
# Opt level: O1

bool __thiscall
libtorrent::aux::encryption_handler::switch_send_crypto
          (encryption_handler *this,shared_ptr<libtorrent::crypto_plugin> *crypto,
          int pending_encryption)

{
  size_t *psVar1;
  _List_node_base *p_Var2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  iterator b;
  encryption_handler *peVar3;
  _List_node_base *p_Var4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  bool bVar5;
  
  peVar3 = (encryption_handler *)
           (this->m_send_barriers).
           super__List_base<libtorrent::aux::encryption_handler::barrier,_std::allocator<libtorrent::aux::encryption_handler::barrier>_>
           ._M_impl._M_node.super__List_node_base._M_next;
  if (peVar3 == this) {
    bVar5 = (crypto->super___shared_ptr<libtorrent::crypto_plugin,_(__gnu_cxx::_Lock_policy)2>).
            _M_ptr != (element_type *)0x0;
  }
  else {
    for (; peVar3 != (encryption_handler *)
                     (this->m_send_barriers).
                     super__List_base<libtorrent::aux::encryption_handler::barrier,_std::allocator<libtorrent::aux::encryption_handler::barrier>_>
                     ._M_impl._M_node.super__List_node_base._M_prev;
        peVar3 = (encryption_handler *)
                 (peVar3->m_send_barriers).
                 super__List_base<libtorrent::aux::encryption_handler::barrier,_std::allocator<libtorrent::aux::encryption_handler::barrier>_>
                 ._M_impl._M_node.super__List_node_base._M_next) {
      pending_encryption =
           pending_encryption -
           *(int *)&(peVar3->m_dec_handler).
                    super___shared_ptr<libtorrent::crypto_plugin,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi;
    }
    *(int *)&(this->m_send_barriers).
             super__List_base<libtorrent::aux::encryption_handler::barrier,_std::allocator<libtorrent::aux::encryption_handler::barrier>_>
             ._M_impl._M_node.super__List_node_base._M_prev[2]._M_next = pending_encryption;
    bVar5 = false;
  }
  p_Var2 = (_List_node_base *)
           (crypto->super___shared_ptr<libtorrent::crypto_plugin,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  if (p_Var2 != (_List_node_base *)0x0) {
    this_00 = (crypto->super___shared_ptr<libtorrent::crypto_plugin,_(__gnu_cxx::_Lock_policy)2>).
              _M_refcount._M_pi;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        this_00->_M_use_count = this_00->_M_use_count + 1;
        UNLOCK();
      }
      else {
        this_00->_M_use_count = this_00->_M_use_count + 1;
      }
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          this_00->_M_use_count = this_00->_M_use_count + 1;
          UNLOCK();
        }
        else {
          this_00->_M_use_count = this_00->_M_use_count + 1;
        }
      }
    }
    p_Var4 = (_List_node_base *)operator_new(0x28);
    p_Var4[1]._M_next = p_Var2;
    p_Var4[1]._M_prev = (_List_node_base *)this_00;
    *(undefined4 *)&p_Var4[2]._M_next = 0x7fffffff;
    ::std::__detail::_List_node_base::_M_hook(p_Var4);
    psVar1 = &(this->m_send_barriers).
              super__List_base<libtorrent::aux::encryption_handler::barrier,_std::allocator<libtorrent::aux::encryption_handler::barrier>_>
              ._M_impl._M_node._M_size;
    *psVar1 = *psVar1 + 1;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    }
  }
  return bVar5;
}

Assistant:

bool encryption_handler::switch_send_crypto(std::shared_ptr<crypto_plugin> crypto
		, int pending_encryption)
	{
		bool place_barrier = false;
		if (!m_send_barriers.empty())
		{
			auto const end = std::prev(m_send_barriers.end());
			for (auto b = m_send_barriers.begin(); b != end; ++b)
				pending_encryption -= b->next;
			TORRENT_ASSERT(pending_encryption >= 0);
			m_send_barriers.back().next = pending_encryption;
		}
		else if (crypto)
			place_barrier = true;

		if (crypto)
			m_send_barriers.push_back(barrier(crypto, INT_MAX));

		return place_barrier;
	}